

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_real(void)

{
  mpc_parser_t *pmVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *p3;
  mpc_parser_t *p32;
  mpc_parser_t *p31;
  mpc_parser_t *p30;
  mpc_parser_t *p2;
  mpc_parser_t *p1;
  mpc_parser_t *p0;
  mpc_ctor_t in_stack_ffffffffffffffa8;
  code *pcVar7;
  mpc_parser_t *in_stack_ffffffffffffffb0;
  code *a;
  
  mpc_oneof((char *)in_stack_ffffffffffffffb0);
  pmVar1 = mpc_maybe_lift(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pmVar2 = mpc_digits();
  pmVar3 = mpc_char((char)((ulong)in_stack_ffffffffffffffb0 >> 0x38));
  pmVar4 = mpc_digits();
  mpc_and(2,mpcf_strfold,pmVar3,pmVar4,free);
  pmVar3 = mpc_maybe_lift(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pmVar4 = mpc_oneof((char *)in_stack_ffffffffffffffb0);
  mpc_oneof((char *)in_stack_ffffffffffffffb0);
  pmVar5 = mpc_maybe_lift(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pmVar6 = mpc_digits();
  pcVar7 = free;
  mpc_and(3,mpcf_strfold,pmVar4,pmVar5,pmVar6,free);
  pmVar4 = mpc_maybe_lift(in_stack_ffffffffffffffb0,pcVar7);
  pcVar7 = free;
  a = free;
  mpc_and(4,mpcf_strfold,pmVar1,pmVar2,pmVar3,pmVar4,free,free,free);
  pmVar1 = mpc_expect((mpc_parser_t *)a,(char *)pcVar7);
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_real(void) {

  /* [+-]?\d+(\.\d+)?([eE][+-]?[0-9]+)? */

  mpc_parser_t *p0, *p1, *p2, *p30, *p31, *p32, *p3;

  p0 = mpc_maybe_lift(mpc_oneof("+-"), mpcf_ctor_str);
  p1 = mpc_digits();
  p2 = mpc_maybe_lift(mpc_and(2, mpcf_strfold, mpc_char('.'), mpc_digits(), free), mpcf_ctor_str);
  p30 = mpc_oneof("eE");
  p31 = mpc_maybe_lift(mpc_oneof("+-"), mpcf_ctor_str);
  p32 = mpc_digits();
  p3 = mpc_maybe_lift(mpc_and(3, mpcf_strfold, p30, p31, p32, free, free), mpcf_ctor_str);

  return mpc_expect(mpc_and(4, mpcf_strfold, p0, p1, p2, p3, free, free, free), "real");

}